

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void libtorrent::dht::anon_unknown_0::announce_fun
               (vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *v,node *node,int listen_port,sha1_hash *ih,announce_flags_t flags)

{
  observer_flags_t *poVar1;
  dht_observer *pdVar2;
  pointer ppVar3;
  int iVar4;
  entry *peVar5;
  entry *peVar6;
  sha1_hash *psVar7;
  pointer ppVar8;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  span<const_char> str;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  span<const_char> in;
  shared_ptr<libtorrent::dht::announce_observer> o;
  shared_ptr<libtorrent::dht::traversal_algorithm> algo;
  __shared_ptr<libtorrent::dht::observer,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  entry e;
  string_type local_70;
  endpoint local_4c;
  
  pdVar2 = node->m_observer;
  if (pdVar2 != (dht_observer *)0x0) {
    psVar7 = ih;
    iVar4 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,1);
    if ((char)iVar4 != '\0') {
      in.m_len = (difference_type)psVar7;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&e,(aux *)ih,in);
      (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                (pdVar2,1,"sending announce_peer [ ih: %s  p: %d nodes: %d ]",
                 e.super_variant_type.
                 super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 .
                 super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                 ._M_u._M_first._M_storage,(ulong)(uint)listen_port,
                 ((long)(v->
                        super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(v->
                       super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x60 & 0xffffffff);
      ::std::__cxx11::string::~string((string *)&e);
    }
  }
  digest32<160L>::clear((digest32<160L> *)&e);
  ::std::
  make_shared<libtorrent::dht::traversal_algorithm,libtorrent::dht::node&,libtorrent::digest32<160l>>
            ((node *)&algo,(digest32<160L> *)node);
  ppVar8 = (v->
           super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (v->
           super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar8 == ppVar3) {
LAB_0036020b:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&algo.
                  super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    if (pdVar2 != (dht_observer *)0x0) {
      iVar4 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,1);
      if ((char)iVar4 != '\0') {
        iVar4 = distance_exp(ih,&(ppVar8->first).id);
        (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar2,1,"announce-distance: %d",(ulong)(0xa0 - iVar4));
      }
    }
    aux::union_endpoint::operator_cast_to_basic_endpoint((endpoint *)&e,&(ppVar8->first).endpoint);
    rpc_manager::
    allocate_observer<libtorrent::dht::announce_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,libtorrent::digest32<160l>const&>
              ((rpc_manager *)&o,(shared_ptr<libtorrent::dht::traversal_algorithm> *)&node->m_rpc,
               (basic_endpoint<boost::asio::ip::udp> *)&algo,(digest32<160L> *)&e);
    if (o.super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&o.
                  super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_0036020b;
    }
    entry::entry(&e);
    key._M_str = "y";
    key._M_len = 1;
    peVar5 = entry::operator[](&e,key);
    entry::operator=(peVar5,"q");
    key_00._M_str = "q";
    key_00._M_len = 1;
    peVar5 = entry::operator[](&e,key_00);
    entry::operator=(peVar5,"announce_peer");
    key_01._M_str = "a";
    key_01._M_len = 1;
    peVar5 = entry::operator[](&e,key_01);
    key_02._M_str = "info_hash";
    key_02._M_len = 9;
    peVar6 = entry::operator[](peVar5,key_02);
    str.m_len = 0x14;
    str.m_ptr = (char *)ih;
    entry::operator=(peVar6,str);
    key_03._M_str = "port";
    key_03._M_len = 4;
    peVar6 = entry::operator[](peVar5,key_03);
    entry::operator=(peVar6,(long)listen_port);
    ::std::__cxx11::string::string((string *)&local_70,(string *)&ppVar8->second);
    key_04._M_str = "token";
    key_04._M_len = 5;
    peVar6 = entry::operator[](peVar5,key_04);
    entry::operator=(peVar6,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    key_05._M_str = "seed";
    key_05._M_len = 4;
    peVar6 = entry::operator[](peVar5,key_05);
    entry::operator=(peVar6,(ulong)(flags.m_val & 1));
    if ((flags.m_val & 2) != 0) {
      key_06._M_str = "implied_port";
      key_06._M_len = 0xc;
      peVar5 = entry::operator[](peVar5,key_06);
      entry::operator=(peVar5,1);
    }
    counters::inc_stats_counter(node->m_counters,0x96,1);
    poVar1 = &((o.super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_observer).flags;
    poVar1->m_val = poVar1->m_val | 1;
    aux::union_endpoint::operator_cast_to_basic_endpoint(&local_4c,&(ppVar8->first).endpoint);
    ::std::__shared_ptr<libtorrent::dht::observer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::announce_observer,void>
              (local_a8,&o.
                         super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
              );
    rpc_manager::invoke(&node->m_rpc,&e,&local_4c,(observer_ptr *)local_a8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    entry::~entry(&e);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&o.super___shared_ptr<libtorrent::dht::announce_observer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ppVar8 = ppVar8 + 1;
  } while( true );
}

Assistant:

void announce_fun(std::vector<std::pair<node_entry, std::string>> const& v
		, node& node, int const listen_port, sha1_hash const& ih, announce_flags_t const flags)
	{
#ifndef TORRENT_DISABLE_LOGGING
		auto* logger = node.observer();
		if (logger != nullptr && logger->should_log(dht_logger::node))
		{
			logger->log(dht_logger::node, "sending announce_peer [ ih: %s "
				" p: %d nodes: %d ]", aux::to_hex(ih).c_str(), listen_port, int(v.size()));
		}
#endif

		// create a dummy traversal_algorithm
		auto algo = std::make_shared<traversal_algorithm>(node, node_id());
		// store on the first k nodes
		for (auto const& p : v)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::node))
			{
				logger->log(dht_logger::node, "announce-distance: %d"
					, (160 - distance_exp(ih, p.first.id)));
			}
#endif

			auto o = node.m_rpc.allocate_observer<announce_observer>(algo
				, p.first.ep(), p.first.id);
			if (!o) return;
#if TORRENT_USE_ASSERTS
			o->m_in_constructor = false;
#endif
			entry e;
			e["y"] = "q";
			e["q"] = "announce_peer";
			entry& a = e["a"];
			a["info_hash"] = ih;
			a["port"] = listen_port;
			a["token"] = p.second;
			a["seed"] = (flags & announce::seed) ? 1 : 0;
			if (flags & announce::implied_port) a["implied_port"] = 1;
			node.stats_counters().inc_stats_counter(counters::dht_announce_peer_out);
			o->flags |= observer::flag_queried;
			node.m_rpc.invoke(e, p.first.ep(), o);
		}
	}